

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.h
# Opt level: O3

void __thiscall gvr::PointCloud::translate(PointCloud *this,Vector3d *v)

{
  float *pfVar1;
  int i;
  long lVar2;
  uint uVar3;
  Vector3d *pVVar4;
  ulong uVar5;
  Vector3d t;
  SVector<double,_3> ret_1;
  
  pVVar4 = &(this->super_Model).origin;
  t.v[0] = 0.0;
  t.v[1] = 0.0;
  t.v[2] = 0.0;
  lVar2 = 0;
  do {
    t.v[lVar2] = v->v[lVar2] + pVVar4->v[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  if (((((t.v[0] != 0.0) || (NAN(t.v[0]))) || (t.v[1] != 0.0)) ||
      (((NAN(t.v[1]) || (t.v[2] != 0.0)) || (NAN(t.v[2]))))) &&
     (uVar3 = this->n * 3 - 3, -1 < (int)uVar3)) {
    pfVar1 = this->vertex;
    uVar5 = (ulong)uVar3 + 3;
    do {
      *(ulong *)(pfVar1 + (uVar5 - 3)) =
           CONCAT44((float)((ulong)*(undefined8 *)(pfVar1 + (uVar5 - 3)) >> 0x20) + (float)t.v[1],
                    (float)*(undefined8 *)(pfVar1 + (uVar5 - 3)) + (float)t.v[0]);
      pfVar1[uVar5 - 1] = pfVar1[uVar5 - 1] + (float)t.v[2];
      uVar5 = uVar5 - 3;
    } while (2 < uVar5);
    pfVar1 = this->scanpos;
    if (pfVar1 != (float *)0x0 && -1 < (int)uVar3) {
      uVar5 = (ulong)uVar3 + 3;
      do {
        *(ulong *)(pfVar1 + (uVar5 - 3)) =
             CONCAT44((float)((ulong)*(undefined8 *)(pfVar1 + (uVar5 - 3)) >> 0x20) + (float)t.v[1],
                      (float)*(undefined8 *)(pfVar1 + (uVar5 - 3)) + (float)t.v[0]);
        pfVar1[uVar5 - 1] = pfVar1[uVar5 - 1] + (float)t.v[2];
        uVar5 = uVar5 - 3;
      } while (2 < uVar5);
    }
  }
  pVVar4->v[0] = 0.0;
  (this->super_Model).origin.v[1] = 0.0;
  lVar2 = 0;
  (this->super_Model).origin.v[2] = 0.0;
  pVVar4 = &(this->super_Model).Tc;
  ret_1.v[2] = 0.0;
  ret_1.v[0] = 0.0;
  ret_1.v[1] = 0.0;
  do {
    ret_1.v[lVar2] = pVVar4->v[lVar2] + t.v[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  (this->super_Model).Tc.v[2] = ret_1.v[2];
  pVVar4->v[0] = ret_1.v[0];
  (this->super_Model).Tc.v[1] = ret_1.v[1];
  return;
}

Assistant:

const gmath::Vector3d &getOrigin() const { return origin; }